

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O0

void __thiscall lsim::SimComponent::set_user_value(SimComponent *this,uint32_t index,Value value)

{
  size_type sVar1;
  reference pvVar2;
  Value value_local;
  uint32_t index_local;
  SimComponent *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pins);
  if (index < sVar1) {
    pvVar2 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                       (&this->m_user_values,(ulong)index);
    *pvVar2 = value;
    Simulator::activate_independent_simulation_func(this->m_sim,this);
    return;
  }
  __assert_fail("index < m_pins.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_component.cpp"
                ,99,"void lsim::SimComponent::set_user_value(uint32_t, Value)");
}

Assistant:

void SimComponent::set_user_value(uint32_t index, Value value) {
	assert(index < m_pins.size());
	m_user_values[index] = value;
	m_sim->activate_independent_simulation_func(this);
}